

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialManager.cpp
# Opt level: O1

bool __thiscall
MT32Emu::PartialManager::abortFirstPolyPreferHeldWhereReserveExceeded
          (PartialManager *this,int minPart)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  
  iVar6 = -1;
  if (minPart != 8) {
    iVar6 = minPart;
  }
  bVar4 = iVar6 < 8;
  if (iVar6 < 8) {
    iVar5 = 8;
    do {
      iVar2 = iVar5 + -1;
      if (iVar5 == 0) {
        iVar2 = 8;
      }
      uVar3 = Part::getActivePartialCount(this->parts[iVar2]);
      if ((this->numReservedPartialsForPart[iVar2] < uVar3) &&
         (bVar1 = Part::abortFirstPolyPreferHeld(this->parts[iVar2]), bVar1)) {
        return bVar4;
      }
      iVar5 = iVar5 + -1;
      bVar4 = iVar6 < iVar5;
    } while (iVar6 < iVar5);
  }
  return bVar4;
}

Assistant:

bool PartialManager::abortFirstPolyPreferHeldWhereReserveExceeded(int minPart) {
	if (minPart == 8) {
		// Rhythm is highest priority
		minPart = -1;
	}
	for (int partNum = 7; partNum >= minPart; partNum--) {
		int usePartNum = partNum == -1 ? 8 : partNum;
		if (parts[usePartNum]->getActivePartialCount() > numReservedPartialsForPart[usePartNum]) {
			// This part has exceeded its reserved partial count.
			// If it has any polys, kill its first (preferably held) one and we're done.
			if (parts[usePartNum]->abortFirstPolyPreferHeld()) {
				return true;
			}
		}
	}
	return false;
}